

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * dbReallocFinish(sqlite3 *db,void *p,u64 n)

{
  int iVar1;
  void *local_28;
  void *pNew;
  u64 n_local;
  void *p_local;
  sqlite3 *db_local;
  
  local_28 = (void *)0x0;
  if (db->mallocFailed == '\0') {
    iVar1 = isLookaside(db,p);
    if (iVar1 == 0) {
      local_28 = sqlite3Realloc(p,n);
      if (local_28 == (void *)0x0) {
        sqlite3OomFault(db);
      }
    }
    else {
      local_28 = sqlite3DbMallocRawNN(db,n);
      if (local_28 != (void *)0x0) {
        iVar1 = lookasideMallocSize(db,p);
        memcpy(local_28,p,(long)iVar1);
        sqlite3DbFree(db,p);
      }
    }
  }
  return local_28;
}

Assistant:

static SQLITE_NOINLINE void *dbReallocFinish(sqlite3 *db, void *p, u64 n){
  void *pNew = 0;
  assert( db!=0 );
  assert( p!=0 );
  if( db->mallocFailed==0 ){
    if( isLookaside(db, p) ){
      pNew = sqlite3DbMallocRawNN(db, n);
      if( pNew ){
        memcpy(pNew, p, lookasideMallocSize(db, p));
        sqlite3DbFree(db, p);
      }
    }else{
      assert( sqlite3MemdebugHasType(p, (MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      assert( sqlite3MemdebugNoType(p, (u8)~(MEMTYPE_LOOKASIDE|MEMTYPE_HEAP)) );
      sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
      pNew = sqlite3Realloc(p, n);
      if( !pNew ){
        sqlite3OomFault(db);
      }
      sqlite3MemdebugSetType(pNew,
            (db->lookaside.bDisable==0 ? MEMTYPE_LOOKASIDE : MEMTYPE_HEAP));
    }
  }
  return pNew;
}